

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O1

void ABC_TargetResFree(CSAT_Target_ResultT *p)

{
  long lVar1;
  
  if (p != (CSAT_Target_ResultT *)0x0) {
    if ((p->names != (char **)0x0) && (0 < p->no_sig)) {
      lVar1 = 0;
      do {
        if (p->names[lVar1] != (char *)0x0) {
          free(p->names[lVar1]);
          p->names[lVar1] = (char *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < p->no_sig);
    }
    if (p->names != (char **)0x0) {
      free(p->names);
      p->names = (char **)0x0;
    }
    if (p->values != (int *)0x0) {
      free(p->values);
      p->values = (int *)0x0;
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void ABC_TargetResFree( CSAT_Target_ResultT * p )
{
    if ( p == NULL )
        return;
    if( p->names )
    {
        int i = 0;
        for ( i = 0; i < p->no_sig; i++ )
        {
            ABC_FREE(p->names[i]);
        }
    }
    ABC_FREE( p->names );
    ABC_FREE( p->values );
    ABC_FREE( p );
}